

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

void duckdb::ProfileOutputSetting::ResetLocal(ClientContext *context)

{
  ClientConfig *pCVar1;
  undefined1 auStack_1f8 [488];
  
  switchD_016d4fed::default(auStack_1f8,0,0x1e8);
  ClientConfig::ClientConfig((ClientConfig *)auStack_1f8);
  pCVar1 = ClientConfig::GetConfig(context);
  ::std::__cxx11::string::operator=
            ((string *)&pCVar1->profiler_save_location,(string *)(auStack_1f8 + 0x28));
  ClientConfig::~ClientConfig((ClientConfig *)auStack_1f8);
  return;
}

Assistant:

void ProfileOutputSetting::ResetLocal(ClientContext &context) {
	ClientConfig::GetConfig(context).profiler_save_location = ClientConfig().profiler_save_location;
}